

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateByteSize
          (MessageGenerator *this,Printer *printer)

{
  pointer *__return_storage_ptr__;
  FieldDescriptor *this_00;
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  MessageOptions *this_01;
  FileDescriptor *pFVar5;
  string *psVar6;
  ulong uVar7;
  size_type sVar8;
  reference ppFVar9;
  FieldGenerator *pFVar10;
  reference pvVar11;
  LogMessage *pLVar12;
  OneofDescriptor *pOVar13;
  int __c;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  uint i_00;
  FieldDescriptor *field_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *masks;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  char *pcVar14;
  bool local_549;
  int local_50c;
  bool local_4e9;
  string local_430;
  string local_410;
  FieldDescriptor *local_3f0;
  FieldDescriptor *field_6;
  int local_3e0;
  int j_1;
  int i_4;
  string local_3b8;
  byte local_391;
  FieldGenerator *pFStack_390;
  bool have_enclosing_if;
  FieldGenerator *generator_1;
  FieldDescriptor *field_5;
  undefined1 local_378 [4];
  int j;
  string local_358;
  LogFinisher local_332;
  byte local_331;
  LogMessage local_330;
  LogFinisher local_2f2;
  byte local_2f1;
  LogMessage local_2f0;
  bool local_2b1;
  int local_2b0;
  LogFinisher local_2aa;
  bool have_outer_if;
  int count;
  LogFinisher local_26a;
  byte local_269;
  LogMessage local_268;
  LogFinisher local_22a;
  byte local_229;
  LogMessage local_228;
  int local_1f0;
  int local_1ec;
  int chunk;
  int index;
  FieldDescriptor *field_4;
  uint32 last_chunk_mask;
  int last_chunk_end;
  int last_chunk_start;
  int last_chunk;
  FieldGenerator *generator;
  FieldDescriptor *field_3;
  LogMessage local_1b8;
  uint32 local_180;
  uint32 local_17c;
  int i_3;
  int last_i;
  FieldDescriptor *local_158;
  FieldDescriptor *field_2;
  FieldDescriptor *pFStack_148;
  int i_2;
  FieldDescriptor *field_1;
  undefined1 local_138 [4];
  int i_1;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> masks_for_has_bits;
  FieldDescriptor *field;
  LogFinisher local_65;
  int i;
  byte local_51;
  LogMessage local_50;
  Printer *local_18;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  this_01 = Descriptor::options(this->descriptor_);
  bVar2 = MessageOptions::message_set_wire_format(this_01);
  pPVar1 = local_18;
  if (bVar2) {
    psVar6 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,
                       "size_t $classname$::ByteSizeLong() const {\n// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n  size_t total_size = _extensions_.MessageSetByteSize();\n"
                       ,"classname",&this->classname_,"full_name",psVar6);
    pFVar5 = Descriptor::file(this->descriptor_);
    bVar2 = UseUnknownFieldSet(pFVar5,&this->options_);
    local_51 = 0;
    if (!bVar2) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xf64);
      local_51 = 1;
      pLVar12 = internal::LogMessage::operator<<
                          (&local_50,
                           "CHECK failed: UseUnknownFieldSet(descriptor_->file(), options_): ");
      internal::LogFinisher::operator=(&local_65,pLVar12);
    }
    if ((local_51 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_50);
    }
    io::Printer::Print(local_18,
                       "if (_internal_metadata_.have_unknown_fields()) {\n  total_size += ::google::protobuf::internal::WireFormat::\n      ComputeUnknownMessageSetItemsSize(unknown_fields());\n}\n"
                      );
    io::Printer::Print(local_18,
                       "  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);\n  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n  _cached_size_ = cached_size;\n  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n  return total_size;\n}\n"
                      );
    return;
  }
  if (1 < this->num_required_fields_) {
    pFVar5 = Descriptor::file(this->descriptor_);
    bVar2 = HasFieldPresence(pFVar5);
    pPVar1 = local_18;
    if (bVar2) {
      psVar6 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
      io::Printer::Print(pPVar1,
                         "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n// @@protoc_insertion_point(required_fields_byte_size_fallback_start:$full_name$)\n"
                         ,"classname",&this->classname_,"full_name",psVar6);
      io::Printer::Indent(local_18);
      io::Printer::Print(local_18,"size_t total_size = 0;\n");
      for (field._4_4_ = 0;
          sVar8 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::size(&this->optimized_order_), (ulong)(long)field._4_4_ < sVar8;
          field._4_4_ = field._4_4_ + 1) {
        ppFVar9 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](&this->optimized_order_,(long)field._4_4_);
        this_00 = *ppFVar9;
        bVar2 = FieldDescriptor::is_required(this_00);
        pPVar1 = local_18;
        if (bVar2) {
          __return_storage_ptr__ =
               &masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
          FieldName_abi_cxx11_((string *)__return_storage_ptr__,(cpp *)this_00,field_00);
          io::Printer::Print(pPVar1,"\nif (has_$name$()) {\n","name",
                             (string *)__return_storage_ptr__);
          std::__cxx11::string::~string
                    ((string *)
                     &masks_for_has_bits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          io::Printer::Indent(local_18);
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(local_18,this_00);
          pFVar10 = FieldGeneratorMap::get(&this->field_generators_,this_00);
          (*pFVar10->_vptr_FieldGenerator[0x17])(pFVar10,local_18);
          io::Printer::Outdent(local_18);
          io::Printer::Print(local_18,"}\n");
        }
      }
      io::Printer::Print(local_18,"\nreturn total_size;\n");
      io::Printer::Outdent(local_18);
      io::Printer::Print(local_18,"}\n");
    }
  }
  pPVar1 = local_18;
  psVar6 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
  io::Printer::Print(pPVar1,
                     "size_t $classname$::ByteSizeLong() const {\n// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n"
                     ,"classname",&this->classname_,"full_name",psVar6);
  io::Printer::Indent(local_18);
  io::Printer::Print(local_18,"size_t total_size = 0;\n\n");
  iVar3 = Descriptor::extension_range_count(this->descriptor_);
  if (0 < iVar3) {
    io::Printer::Print(local_18,"total_size += _extensions_.ByteSize();\n\n");
  }
  bVar2 = PreserveUnknownFields(this->descriptor_);
  if (bVar2) {
    pFVar5 = Descriptor::file(this->descriptor_);
    bVar2 = UseUnknownFieldSet(pFVar5,&this->options_);
    if (bVar2) {
      io::Printer::Print(local_18,
                         "if (_internal_metadata_.have_unknown_fields()) {\n  total_size +=\n    ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(\n      unknown_fields());\n}\n"
                        );
    }
    else {
      io::Printer::Print(local_18,"total_size += unknown_fields().size();\n\n");
    }
  }
  if (1 < this->num_required_fields_) {
    pFVar5 = Descriptor::file(this->descriptor_);
    bVar2 = HasFieldPresence(pFVar5);
    if (bVar2) {
      RequiredFieldsBitMask((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0,this);
      pPVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"if (",&local_111);
      ConditionalToCheckBitmasks_abi_cxx11_((string *)local_138,(cpp *)local_b0,masks);
      std::operator+(&local_f0,&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138)
      ;
      std::operator+(&local_d0,&local_f0,") {  // All required fields are present.\n");
      pcVar14 = (char *)std::__cxx11::string::c_str();
      io::Printer::Print(pPVar1,pcVar14);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)local_138);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_111);
      io::Printer::Indent(local_18);
      for (field_1._4_4_ = 0; uVar7 = (ulong)field_1._4_4_,
          sVar8 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::size(&this->optimized_order_), uVar7 < sVar8; field_1._4_4_ = field_1._4_4_ + 1)
      {
        ppFVar9 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](&this->optimized_order_,(long)field_1._4_4_);
        pFStack_148 = *ppFVar9;
        bVar2 = FieldDescriptor::is_required(pFStack_148);
        if (bVar2) {
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(local_18,pFStack_148)
          ;
          pFVar10 = FieldGeneratorMap::get(&this->field_generators_,pFStack_148);
          (*pFVar10->_vptr_FieldGenerator[0x17])(pFVar10,local_18);
          io::Printer::Print(local_18,"\n");
        }
      }
      io::Printer::Outdent(local_18);
      io::Printer::Print(local_18,"} else {\n  total_size += RequiredFieldsByteSizeFallback();\n}\n"
                        );
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0);
      goto LAB_003f43ef;
    }
  }
  for (field_2._4_4_ = 0; uVar7 = (ulong)field_2._4_4_,
      sVar8 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(&this->optimized_order_), uVar7 < sVar8; field_2._4_4_ = field_2._4_4_ + 1) {
    ppFVar9 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](&this->optimized_order_,(long)field_2._4_4_);
    local_158 = *ppFVar9;
    bVar2 = FieldDescriptor::is_required(local_158);
    if (bVar2) {
      anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(local_18,local_158);
      pPVar1 = local_18;
      FieldName_abi_cxx11_((string *)&i_3,(cpp *)local_158,field_01);
      io::Printer::Print(pPVar1,"if (has_$name$()) {\n","name",(string *)&i_3);
      std::__cxx11::string::~string((string *)&i_3);
      io::Printer::Indent(local_18);
      pFVar10 = FieldGeneratorMap::get(&this->field_generators_,local_158);
      (*pFVar10->_vptr_FieldGenerator[0x17])(pFVar10,local_18);
      io::Printer::Outdent(local_18);
      io::Printer::Print(local_18,"}\n");
    }
  }
LAB_003f43ef:
  local_17c = 0xffffffff;
  local_180 = 0;
  do {
    uVar7 = (ulong)(int)local_180;
    sVar8 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(&this->optimized_order_);
    if (sVar8 <= uVar7) {
      for (local_3e0 = 0; iVar3 = local_3e0, iVar4 = Descriptor::oneof_decl_count(this->descriptor_)
          , pPVar1 = local_18, iVar3 < iVar4; local_3e0 = local_3e0 + 1) {
        pOVar13 = Descriptor::oneof_decl(this->descriptor_,local_3e0);
        psVar6 = OneofDescriptor::name_abi_cxx11_(pOVar13);
        io::Printer::Print(pPVar1,"switch ($oneofname$_case()) {\n","oneofname",psVar6);
        io::Printer::Indent(local_18);
        field_6._4_4_ = 0;
        while( true ) {
          iVar3 = field_6._4_4_;
          pOVar13 = Descriptor::oneof_decl(this->descriptor_,local_3e0);
          iVar4 = OneofDescriptor::field_count(pOVar13);
          pPVar1 = local_18;
          if (iVar4 <= iVar3) break;
          pOVar13 = Descriptor::oneof_decl(this->descriptor_,local_3e0);
          local_3f0 = OneofDescriptor::field(pOVar13,field_6._4_4_);
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(local_18,local_3f0);
          pPVar1 = local_18;
          psVar6 = FieldDescriptor::name_abi_cxx11_(local_3f0);
          UnderscoresToCamelCase(&local_410,psVar6,true);
          io::Printer::Print(pPVar1,"case k$field_name$: {\n","field_name",&local_410);
          std::__cxx11::string::~string((string *)&local_410);
          io::Printer::Indent(local_18);
          pFVar10 = FieldGeneratorMap::get(&this->field_generators_,local_3f0);
          (*pFVar10->_vptr_FieldGenerator[0x17])(pFVar10,local_18);
          io::Printer::Print(local_18,"break;\n");
          io::Printer::Outdent(local_18);
          io::Printer::Print(local_18,"}\n");
          field_6._4_4_ = field_6._4_4_ + 1;
        }
        pOVar13 = Descriptor::oneof_decl(this->descriptor_,local_3e0);
        psVar6 = OneofDescriptor::name_abi_cxx11_(pOVar13);
        ToUpper(&local_430,psVar6);
        io::Printer::Print(pPVar1,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n","cap_oneof_name"
                           ,&local_430);
        std::__cxx11::string::~string((string *)&local_430);
        io::Printer::Outdent(local_18);
        io::Printer::Print(local_18,"}\n");
      }
      if (this->num_weak_fields_ != 0) {
        io::Printer::Print(local_18,"total_size += _weak_field_map_.ByteSizeLong();\n");
      }
      io::Printer::Print(local_18,
                         "int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);\nGOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n_cached_size_ = cached_size;\nGOOGLE_SAFE_CONCURRENT_WRITES_END();\nreturn total_size;\n"
                        );
      io::Printer::Outdent(local_18);
      io::Printer::Print(local_18,"}\n");
      return;
    }
    field_3._7_1_ = 0;
    if (local_180 == local_17c) {
      internal::LogMessage::LogMessage
                (&local_1b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xfd8);
      field_3._7_1_ = 1;
      pLVar12 = internal::LogMessage::operator<<(&local_1b8,"CHECK failed: (i) != (last_i): ");
      internal::LogFinisher::operator=((LogFinisher *)((long)&field_3 + 6),pLVar12);
    }
    if ((field_3._7_1_ & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_1b8);
    }
    local_17c = local_180;
    while( true ) {
      uVar7 = (ulong)(int)local_180;
      sVar8 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(&this->optimized_order_);
      local_4e9 = false;
      if (uVar7 < sVar8) {
        ppFVar9 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](&this->optimized_order_,(long)(int)local_180);
        local_4e9 = FieldDescriptor::is_required(*ppFVar9);
      }
      if (local_4e9 == false) break;
      local_180 = local_180 + 1;
    }
    for (; uVar7 = (ulong)(int)local_180,
        sVar8 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::size(&this->optimized_order_), uVar7 < sVar8; local_180 = local_180 + 1) {
      ppFVar9 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](&this->optimized_order_,(long)(int)local_180);
      generator = (FieldGenerator *)*ppFVar9;
      bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)generator);
      if (!bVar2) break;
      anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>
                (local_18,(FieldDescriptor *)generator);
      _last_chunk_start =
           FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)generator);
      (*_last_chunk_start->_vptr_FieldGenerator[0x17])(_last_chunk_start,local_18);
      io::Printer::Print(local_18,"\n");
    }
    last_chunk_end = -1;
    last_chunk_mask = 0xffffffff;
    field_4._4_4_ = 0xffffffff;
    field_4._0_4_ = 0;
    for (; uVar7 = (ulong)(int)local_180,
        sVar8 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::size(&this->optimized_order_), uVar7 < sVar8; local_180 = local_180 + 1) {
      pcVar14 = (char *)(long)(int)local_180;
      ppFVar9 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](&this->optimized_order_,(size_type)pcVar14);
      _chunk = *ppFVar9;
      bVar2 = FieldDescriptor::is_repeated(_chunk);
      if ((bVar2) || (bVar2 = FieldDescriptor::is_required(_chunk), bVar2)) break;
      pFVar5 = Descriptor::file(this->descriptor_);
      bVar2 = HasFieldPresence(pFVar5);
      if (bVar2) {
        pcVar14 = FieldDescriptor::index(_chunk,pcVar14,__c);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&this->has_bit_indices_,(long)(int)pcVar14);
        local_50c = *pvVar11;
      }
      else {
        local_50c = 0;
      }
      local_1ec = local_50c;
      local_1f0 = local_50c / 8;
      if (last_chunk_end == -1) {
        last_chunk_mask = local_180;
        last_chunk_end = local_1f0;
      }
      else if (local_1f0 != last_chunk_end) break;
      field_4._4_4_ = local_180;
      field_4._0_4_ = 1 << ((byte)((long)local_50c % 0x20) & 0x1f) | (uint)field_4;
    }
    if (last_chunk_end != -1) {
      local_229 = 0;
      if (last_chunk_mask == 0xffffffff) {
        internal::LogMessage::LogMessage
                  (&local_228,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0x1013);
        local_229 = 1;
        pLVar12 = internal::LogMessage::operator<<
                            (&local_228,"CHECK failed: (-1) != (last_chunk_start): ");
        internal::LogFinisher::operator=(&local_22a,pLVar12);
      }
      if ((local_229 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_228);
      }
      local_269 = 0;
      if (field_4._4_4_ == 0xffffffff) {
        internal::LogMessage::LogMessage
                  (&local_268,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0x1014);
        local_269 = 1;
        pLVar12 = internal::LogMessage::operator<<
                            (&local_268,"CHECK failed: (-1) != (last_chunk_end): ");
        internal::LogFinisher::operator=(&local_26a,pLVar12);
      }
      if ((local_269 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_268);
      }
      have_outer_if = false;
      if ((uint)field_4 == 0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&count,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0x1015);
        have_outer_if = true;
        pLVar12 = internal::LogMessage::operator<<
                            ((LogMessage *)&count,"CHECK failed: (0) != (last_chunk_mask): ");
        internal::LogFinisher::operator=(&local_2aa,pLVar12);
      }
      if ((have_outer_if & 1U) != 0) {
        internal::LogMessage::~LogMessage((LogMessage *)&count);
      }
      local_2b0 = popcnt((uint)field_4);
      pFVar5 = Descriptor::file(this->descriptor_);
      bVar2 = HasFieldPresence(pFVar5);
      local_549 = bVar2 && last_chunk_mask != field_4._4_4_;
      local_2b1 = local_549;
      if (bVar2 && last_chunk_mask != field_4._4_4_) {
        local_2f1 = 0;
        iVar3 = extraout_EDX;
        if (local_2b0 < 2) {
          internal::LogMessage::LogMessage
                    (&local_2f0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x101f);
          local_2f1 = 1;
          pLVar12 = internal::LogMessage::operator<<(&local_2f0,"CHECK failed: (2) <= (count): ");
          internal::LogFinisher::operator=(&local_2f2,pLVar12);
          iVar3 = extraout_EDX_00;
        }
        if ((local_2f1 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_2f0);
          iVar3 = extraout_EDX_01;
        }
        local_331 = 0;
        if (8 < local_2b0) {
          internal::LogMessage::LogMessage
                    (&local_330,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x1020);
          local_331 = 1;
          pLVar12 = internal::LogMessage::operator<<(&local_330,"CHECK failed: (8) >= (count): ");
          internal::LogFinisher::operator=(&local_332,pLVar12);
          iVar3 = extraout_EDX_02;
        }
        if ((local_331 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_330);
          iVar3 = extraout_EDX_03;
        }
        pPVar1 = local_18;
        SimpleItoa_abi_cxx11_(&local_358,(protobuf *)(ulong)(uint)(last_chunk_end << 3),iVar3);
        SimpleItoa_abi_cxx11_((string *)local_378,(protobuf *)(ulong)(uint)field_4,i_00);
        io::Printer::Print(pPVar1,"if (_has_bits_[$index$ / 32] & $mask$u) {\n","index",&local_358,
                           "mask",(string *)local_378);
        std::__cxx11::string::~string((string *)local_378);
        std::__cxx11::string::~string((string *)&local_358);
        io::Printer::Indent(local_18);
      }
      for (field_5._4_4_ = last_chunk_mask; (int)field_5._4_4_ <= (int)field_4._4_4_;
          field_5._4_4_ = field_5._4_4_ + 1) {
        ppFVar9 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](&this->optimized_order_,(long)(int)field_5._4_4_);
        generator_1 = (FieldGenerator *)*ppFVar9;
        pFStack_390 = FieldGeneratorMap::get
                                (&this->field_generators_,(FieldDescriptor *)generator_1);
        anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>
                  (local_18,(FieldDescriptor *)generator_1);
        local_391 = 0;
        pFVar5 = Descriptor::file(this->descriptor_);
        bVar2 = HasFieldPresence(pFVar5);
        pPVar1 = local_18;
        if (bVar2) {
          FieldName_abi_cxx11_(&local_3b8,(cpp *)generator_1,field_02);
          io::Printer::Print(pPVar1,"if (has_$name$()) {\n","name",&local_3b8);
          std::__cxx11::string::~string((string *)&local_3b8);
          io::Printer::Indent(local_18);
          local_391 = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&i_4,"this->",(allocator<char> *)((long)&j_1 + 3));
          local_391 = anon_unknown_0::EmitFieldNonDefaultCondition
                                (pPVar1,(string *)&i_4,(FieldDescriptor *)generator_1);
          std::__cxx11::string::~string((string *)&i_4);
          std::allocator<char>::~allocator((allocator<char> *)((long)&j_1 + 3));
        }
        (*pFStack_390->_vptr_FieldGenerator[0x17])(pFStack_390,local_18);
        if ((local_391 & 1) != 0) {
          io::Printer::Outdent(local_18);
          io::Printer::Print(local_18,"}\n\n");
        }
      }
      if ((local_2b1 & 1U) != 0) {
        io::Printer::Outdent(local_18);
        io::Printer::Print(local_18,"}\n");
      }
    }
  } while( true );
}

Assistant:

void MessageGenerator::
GenerateByteSize(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
        "size_t $classname$::ByteSizeLong() const {\n"
        "// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n"
        "  size_t total_size = _extensions_.MessageSetByteSize();\n",
        "classname", classname_, "full_name", descriptor_->full_name());
    GOOGLE_CHECK(UseUnknownFieldSet(descriptor_->file(), options_));
    printer->Print(
      "if (_internal_metadata_.have_unknown_fields()) {\n"
      "  total_size += ::google::protobuf::internal::WireFormat::\n"
      "      ComputeUnknownMessageSetItemsSize(unknown_fields());\n"
      "}\n");
    printer->Print(
      "  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);\n"
      "  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
      "  _cached_size_ = cached_size;\n"
      "  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
      "  return total_size;\n"
      "}\n");
    return;
  }

  if (num_required_fields_ > 1 && HasFieldPresence(descriptor_->file())) {
    // Emit a function (rarely used, we hope) that handles the required fields
    // by checking for each one individually.
    printer->Print(
        "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n"
        "// @@protoc_insertion_point(required_fields_byte_size_fallback_start:"
        "$full_name$)\n",
        "classname", classname_, "full_name", descriptor_->full_name());
    printer->Indent();
    printer->Print("size_t total_size = 0;\n");
    for (int i = 0; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (field->is_required()) {
        printer->Print("\n"
                       "if (has_$name$()) {\n",
                       "name", FieldName(field));
        printer->Indent();
        PrintFieldComment(printer, field);
        field_generators_.get(field).GenerateByteSize(printer);
        printer->Outdent();
        printer->Print("}\n");
      }
    }
    printer->Print("\n"
                   "return total_size;\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  printer->Print(
      "size_t $classname$::ByteSizeLong() const {\n"
      "// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n",
      "classname", classname_, "full_name", descriptor_->full_name());
  printer->Indent();
  printer->Print(
    "size_t total_size = 0;\n"
    "\n");

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "total_size += _extensions_.ByteSize();\n"
      "\n");
  }

  if (PreserveUnknownFields(descriptor_)) {
    if (UseUnknownFieldSet(descriptor_->file(), options_)) {
      printer->Print(
        "if (_internal_metadata_.have_unknown_fields()) {\n"
        "  total_size +=\n"
        "    ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(\n"
        "      unknown_fields());\n"
        "}\n");
    } else {
      printer->Print(
        "total_size += unknown_fields().size();\n"
        "\n");
    }
  }

  // Handle required fields (if any).  We expect all of them to be
  // present, so emit one conditional that checks for that.  If they are all
  // present then the fast path executes; otherwise the slow path executes.
  if (num_required_fields_ > 1 && HasFieldPresence(descriptor_->file())) {
    // The fast path works if all required fields are present.
    const std::vector<uint32> masks_for_has_bits = RequiredFieldsBitMask();
    printer->Print((string("if (") +
                    ConditionalToCheckBitmasks(masks_for_has_bits) +
                    ") {  // All required fields are present.\n").c_str());
    printer->Indent();
    // Oneof fields cannot be required, so optimized_order_ contains all of the
    // fields that we need to potentially emit.
    for (int i = 0; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (!field->is_required()) continue;
      PrintFieldComment(printer, field);
      field_generators_.get(field).GenerateByteSize(printer);
      printer->Print("\n");
    }
    printer->Outdent();
    printer->Print("} else {\n"  // the slow path
                   "  total_size += RequiredFieldsByteSizeFallback();\n"
                   "}\n");
  } else {
    // num_required_fields_ <= 1: no need to be tricky
    for (int i = 0; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (!field->is_required()) continue;
      PrintFieldComment(printer, field);
      printer->Print("if (has_$name$()) {\n",
                     "name", FieldName(field));
      printer->Indent();
      field_generators_.get(field).GenerateByteSize(printer);
      printer->Outdent();
      printer->Print("}\n");
    }
  }

  int last_i = -1;
  for (int i = 0; i < optimized_order_.size(); ) {
    // Detect infinite loops.
    GOOGLE_CHECK_NE(i, last_i);
    last_i = i;

    // Skip required fields.
    for (; i < optimized_order_.size() &&
         optimized_order_[i]->is_required(); i++) {
    }

    // Handle repeated fields.
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (!field->is_repeated()) {
        break;
      }

      PrintFieldComment(printer, field);
      const FieldGenerator& generator = field_generators_.get(field);
      generator.GenerateByteSize(printer);
      printer->Print("\n");
    }

    // Handle optional (non-repeated/oneof) fields.
    //
    // These are handled in chunks of 8.  The first chunk is
    // the non-requireds-non-repeateds-non-unions-non-extensions in
    //  descriptor_->field(0), descriptor_->field(1), ... descriptor_->field(7),
    // and the second chunk is the same for
    //  descriptor_->field(8), descriptor_->field(9), ...
    //  descriptor_->field(15),
    // etc.
    int last_chunk = -1;
    int last_chunk_start = -1;
    int last_chunk_end = -1;
    uint32 last_chunk_mask = 0;
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (field->is_repeated() || field->is_required()) {
        break;
      }

      // "index" defines where in the _has_bits_ the field appears.
      // "i" is our loop counter within optimized_order_.
      int index = HasFieldPresence(descriptor_->file()) ?
          has_bit_indices_[field->index()] : 0;
      int chunk = index / 8;

      if (last_chunk == -1) {
        last_chunk = chunk;
        last_chunk_start = i;
      } else if (chunk != last_chunk) {
        // Emit the fields for this chunk so far.
        break;
      }

      last_chunk_end = i;
      last_chunk_mask |= static_cast<uint32>(1) << (index % 32);
    }

    if (last_chunk != -1) {
      GOOGLE_DCHECK_NE(-1, last_chunk_start);
      GOOGLE_DCHECK_NE(-1, last_chunk_end);
      GOOGLE_DCHECK_NE(0, last_chunk_mask);

      const int count = popcnt(last_chunk_mask);
      const bool have_outer_if = HasFieldPresence(descriptor_->file()) &&
          (last_chunk_start != last_chunk_end);

      if (have_outer_if) {
        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        GOOGLE_DCHECK_LE(2, count);
        GOOGLE_DCHECK_GE(8, count);

        printer->Print(
          "if (_has_bits_[$index$ / 32] & $mask$u) {\n",
          "index", SimpleItoa(last_chunk * 8),
          "mask", SimpleItoa(last_chunk_mask));
        printer->Indent();
      }

      // Go back and emit checks for each of the fields we processed.
      for (int j = last_chunk_start; j <= last_chunk_end; j++) {
        const FieldDescriptor* field = optimized_order_[j];
        const FieldGenerator& generator = field_generators_.get(field);

        PrintFieldComment(printer, field);

        bool have_enclosing_if = false;
        if (HasFieldPresence(descriptor_->file())) {
          printer->Print(
            "if (has_$name$()) {\n",
            "name", FieldName(field));
          printer->Indent();
          have_enclosing_if = true;
        } else {
          // Without field presence: field is serialized only if it has a
          // non-default value.
          have_enclosing_if = EmitFieldNonDefaultCondition(
              printer, "this->", field);
        }

        generator.GenerateByteSize(printer);

        if (have_enclosing_if) {
          printer->Outdent();
          printer->Print(
            "}\n"
            "\n");
        }
      }

      if (have_outer_if) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Fields inside a oneof don't use _has_bits_ so we count them in a separate
  // pass.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
        "switch ($oneofname$_case()) {\n",
        "oneofname", descriptor_->oneof_decl(i)->name());
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      PrintFieldComment(printer, field);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();
      field_generators_.get(field).GenerateByteSize(printer);
      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(descriptor_->oneof_decl(i)->name()));
    printer->Outdent();
    printer->Print(
        "}\n");
  }

  if (num_weak_fields_) {
    // TagSize + MessageSize
    printer->Print("total_size += _weak_field_map_.ByteSizeLong();\n");
  }

  // We update _cached_size_ even though this is a const method.  In theory,
  // this is not thread-compatible, because concurrent writes have undefined
  // results.  In practice, since any concurrent writes will be writing the
  // exact same value, it works on all common processors.  In a future version
  // of C++, _cached_size_ should be made into an atomic<int>.
  printer->Print(
    "int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);\n"
    "GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
    "_cached_size_ = cached_size;\n"
    "GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
    "return total_size;\n");

  printer->Outdent();
  printer->Print("}\n");
}